

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratorManagerPlugin.cpp
# Opt level: O0

void __thiscall GeneratorManagerPlugin::GeneratorManagerPlugin(GeneratorManagerPlugin *this)

{
  GeneratorManagerPlugin *this_local;
  
  plugin::StdPluginLib::StdPluginLib(&this->super_StdPluginLib);
  (this->super_StdPluginLib).super_IPluginLib._vptr_IPluginLib =
       (_func_int **)&PTR__GeneratorManagerPlugin_0011bad8;
  plugin::StdPluginLib::AddExtension<GeneratorManagerImpl>
            ((StdPluginLib *)&this->m_generatorManager);
  plugin::StdPluginLib::AddDependency<plugin::interfaces::INumberGenerator>
            (&this->super_StdPluginLib,0,2);
  return;
}

Assistant:

GeneratorManagerPlugin::GeneratorManagerPlugin():
    m_generatorManager(AddExtension<GeneratorManagerImpl>())

{
    AddDependency<plugin::interfaces::INumberGenerator>(0, 2);
}